

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O0

void var_add(LexState *ls,BCReg nvars)

{
  ushort uVar1;
  FuncState *pFVar2;
  VarInfo *pVVar3;
  VarInfo *v;
  BCReg nactvar;
  FuncState *fs;
  BCReg nvars_local;
  LexState *ls_local;
  
  pFVar2 = ls->fs;
  nactvar = pFVar2->nactvar;
  nvars_local = nvars;
  while (nvars_local != 0) {
    pVVar3 = ls->vstack;
    uVar1 = pFVar2->varmap[nactvar];
    pVVar3[uVar1].startpc = pFVar2->pc;
    pVVar3[uVar1].slot = (uint8_t)nactvar;
    pVVar3[uVar1].info = '\0';
    nactvar = nactvar + 1;
    nvars_local = nvars_local - 1;
  }
  pFVar2->nactvar = nactvar;
  return;
}

Assistant:

static void var_add(LexState *ls, BCReg nvars)
{
  FuncState *fs = ls->fs;
  BCReg nactvar = fs->nactvar;
  while (nvars--) {
    VarInfo *v = &var_get(ls, fs, nactvar);
    v->startpc = fs->pc;
    v->slot = nactvar++;
    v->info = 0;
  }
  fs->nactvar = nactvar;
}